

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

int setup_imm_addr(gen_ctx *gen_ctx,uint64_t v,int *mod,int *rm,int64_t *disp32,int call_p,
                  MIR_item_t func_item)

{
  const_ref_t obj;
  undefined1 auVar1 [32];
  size_t sVar2;
  size_t n;
  const_ref_t cr;
  int call_p_local;
  int64_t *disp32_local;
  int *rm_local;
  int *mod_local;
  uint64_t v_local;
  gen_ctx *gen_ctx_local;
  
  sVar2 = add_to_const_pool(gen_ctx,v);
  setup_rip_rel_addr(0,mod,rm,disp32);
  auVar1 = ZEXT1632(CONCAT88(func_item,CONCAT44(n._4_4_,call_p)));
  obj.const_num = sVar2;
  obj.call_p = auVar1._0_4_;
  obj._4_4_ = auVar1._4_4_;
  obj.func_item = (MIR_item_t)auVar1._8_8_;
  obj.pc = auVar1._16_8_;
  obj.next_insn_disp = auVar1._24_8_;
  VARR_const_ref_tpush(gen_ctx->target_ctx->const_refs,obj);
  sVar2 = VARR_const_ref_tlength(gen_ctx->target_ctx->const_refs);
  return (int)sVar2 + -1;
}

Assistant:

static int setup_imm_addr (struct gen_ctx *gen_ctx, uint64_t v, int *mod, int *rm, int64_t *disp32,
                           int call_p, MIR_item_t func_item) {
  const_ref_t cr;
  size_t n;

  n = add_to_const_pool (gen_ctx, v);
  setup_rip_rel_addr (0, mod, rm, disp32);
  cr.call_p = call_p;
  cr.func_item = func_item;
  cr.pc = 0;
  cr.next_insn_disp = 0;
  cr.const_num = n;
  VARR_PUSH (const_ref_t, const_refs, cr);
  return (int) VARR_LENGTH (const_ref_t, const_refs) - 1;
}